

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLsMassFree(void *arkode_mem)

{
  SUNLinearSolver S;
  int *__ptr;
  
  if ((arkode_mem != (void *)0x0) &&
     (__ptr = (int *)(**(code **)((long)arkode_mem + 0xb0))(), __ptr != (int *)0x0)) {
    S = *(SUNLinearSolver *)(__ptr + 0x24);
    if ((S != (SUNLinearSolver)0x0) && (S->ops != (SUNLinearSolver_Ops)0x0)) {
      if (S->ops->setatimes != (_func_int_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
        SUNLinSolSetATimes(S,(void *)0x0,(SUNATimesFn)0x0);
      }
      if ((*(SUNLinearSolver *)(__ptr + 0x24))->ops->setpreconditioner !=
          (_func_int_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) {
        SUNLinSolSetPreconditioner
                  (*(SUNLinearSolver *)(__ptr + 0x24),(void *)0x0,(SUNPSetupFn)0x0,(SUNPSolveFn)0x0)
        ;
      }
    }
    if (*(N_Vector *)(__ptr + 0x26) != (N_Vector)0x0) {
      N_VDestroy(*(N_Vector *)(__ptr + 0x26));
      __ptr[0x26] = 0;
      __ptr[0x27] = 0;
    }
    if ((*__ptr == 0) && (*(SUNMatrix *)(__ptr + 6) != (SUNMatrix)0x0)) {
      SUNMatDestroy(*(SUNMatrix *)(__ptr + 6));
    }
    __ptr[0x28] = 0;
    __ptr[0x29] = 0;
    __ptr[4] = 0;
    __ptr[5] = 0;
    __ptr[6] = 0;
    __ptr[7] = 0;
    if (*(code **)(__ptr + 0x2e) != (code *)0x0) {
      (**(code **)(__ptr + 0x2e))(arkode_mem);
    }
    free(__ptr);
  }
  return 0;
}

Assistant:

int arkLsMassFree(void *arkode_mem)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  void*        ark_step_massmem;

  /* Return immediately if ARKodeMem, ARKLsMassMem are NULL */
  if (arkode_mem == NULL)  return (ARKLS_SUCCESS);
  ark_mem = (ARKodeMem) arkode_mem;
  ark_step_massmem = ark_mem->step_getmassmem(arkode_mem);
  if (ark_step_massmem == NULL)  return(ARKLS_SUCCESS);
  arkls_mem = (ARKLsMassMem) ark_step_massmem;

  /* detach ARKLs interface routines from LS object (ignore return values) */
  if (arkls_mem->LS) {
    if (arkls_mem->LS->ops) {
      if (arkls_mem->LS->ops->setatimes)
        SUNLinSolSetATimes(arkls_mem->LS, NULL, NULL);

      if (arkls_mem->LS->ops->setpreconditioner)
        SUNLinSolSetPreconditioner(arkls_mem->LS, NULL, NULL, NULL);
    }
  }

  /* Free N_Vector memory */
  if (arkls_mem->x) {
    N_VDestroy(arkls_mem->x);
    arkls_mem->x = NULL;
  }

  /* Free M_lu memory (direct linear solvers) */
  if (!(arkls_mem->iterative) && arkls_mem->M_lu) {
    SUNMatDestroy(arkls_mem->M_lu);
  }
  arkls_mem->M_lu = NULL;

  /* Nullify other N_Vector pointers */
  arkls_mem->ycur = NULL;

  /* Nullify other SUNMatrix pointer */
  arkls_mem->M = NULL;

  /* Free preconditioner memory (if applicable) */
  if (arkls_mem->pfree)
    arkls_mem->pfree(ark_mem);

  /* free ARKLs interface structure */
  free(arkls_mem);

  return(ARKLS_SUCCESS);
}